

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O1

int statemachine_parse(statemachine_ctx *ctx,char *str,int size)

{
  char cVar1;
  int iVar2;
  statemachine_definition *psVar3;
  int **ppiVar4;
  ulong uVar5;
  char **ppcVar6;
  int iVar7;
  long lVar8;
  char encoded_char [10];
  char local_3a [10];
  
  if (((ctx == (statemachine_ctx *)0x0) ||
      (psVar3 = ctx->definition, psVar3 == (statemachine_definition *)0x0)) ||
     (ppiVar4 = psVar3->transition_table, ppiVar4 == (int **)0x0)) {
    __assert_fail("ctx !=NULL && ctx->definition != NULL && ctx->definition->transition_table != NULL"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O1/src/tests/statemachine.c"
                  ,0x188,"int statemachine_parse(statemachine_ctx *, const char *, int)");
  }
  if (size < 0) {
    builtin_strncpy(ctx->error_msg,"Negative size in statemachine_parse().",0x27);
LAB_0010405d:
    iVar7 = 0x7f;
  }
  else {
    if (size != 0) {
      lVar8 = 0;
      do {
        cVar1 = str[lVar8];
        ctx->current_char = cVar1;
        iVar7 = ctx->current_state;
        iVar2 = ppiVar4[iVar7][(byte)str[lVar8]];
        ctx->next_state = iVar2;
        if (iVar2 == 0x7f) {
          statemachine_encode_char(cVar1,local_3a,10);
          ppcVar6 = ctx->definition->state_names;
          if (ppcVar6 == (char **)0x0) {
            snprintf(ctx->error_msg,0x50,"Unexpected character \'%s\'",local_3a);
          }
          else {
            snprintf(ctx->error_msg,0x50,"Unexpected character \'%s\' in state \'%s\'",local_3a,
                     ppcVar6[ctx->current_state]);
          }
          goto LAB_0010405d;
        }
        if ((iVar7 != iVar2) && (psVar3->exit_state_events[iVar7] != (state_event_function)0x0)) {
          (*psVar3->exit_state_events[iVar7])(ctx,iVar7,str[lVar8],iVar2);
        }
        iVar7 = ctx->next_state;
        if ((ctx->current_state != iVar7) &&
           (psVar3->enter_state_events[iVar7] != (state_event_function)0x0)) {
          (*psVar3->enter_state_events[iVar7])(ctx,ctx->current_state,str[lVar8],iVar7);
        }
        if (psVar3->in_state_events[ctx->next_state] != (state_event_function)0x0) {
          (*psVar3->in_state_events[ctx->next_state])
                    (ctx,ctx->current_state,str[lVar8],ctx->next_state);
        }
        if ((ctx->recording != 0) && (uVar5 = ctx->record_pos, uVar5 < 0xff)) {
          cVar1 = str[lVar8];
          ctx->record_pos = uVar5 + 1;
          ctx->record_buffer[uVar5] = cVar1;
          ctx->record_buffer[ctx->record_pos] = '\0';
        }
        ctx->current_state = ctx->next_state;
        ctx->column_number = ctx->column_number + 1;
        if (str[lVar8] == '\n') {
          ctx->line_number = ctx->line_number + 1;
          ctx->column_number = 1;
        }
        lVar8 = lVar8 + 1;
      } while (size != (int)lVar8);
    }
    iVar7 = ctx->current_state;
  }
  return iVar7;
}

Assistant:

int statemachine_parse(statemachine_ctx *ctx, const char *str, int size)
{
    int i;
    const int* const* state_table = ctx->definition->transition_table;
    statemachine_definition *def;

    assert(ctx !=NULL &&
           ctx->definition != NULL &&
           ctx->definition->transition_table != NULL);

    if (size < 0) {
        snprintf(ctx->error_msg, STATEMACHINE_MAX_STR_ERROR, "%s",
                 "Negative size in statemachine_parse().");
        return STATEMACHINE_ERROR;
    }

    def = ctx->definition;

    for (i = 0; i < size; i++) {
        ctx->current_char = *str;
        ctx->next_state =
            state_table[ctx->current_state][CAST(unsigned char, *str)];
        if (ctx->next_state == STATEMACHINE_ERROR) {
            statemachine_set_transition_error_message(ctx);
            return STATEMACHINE_ERROR;
        }

        if (ctx->current_state != ctx->next_state) {
            if (def->exit_state_events[ctx->current_state])
                def->exit_state_events[ctx->current_state](ctx,
                                                           ctx->current_state,
                                                           *str,
                                                           ctx->next_state);
        }
        if (ctx->current_state != ctx->next_state) {
            if (def->enter_state_events[ctx->next_state])
                def->enter_state_events[ctx->next_state](ctx,
                                                         ctx->current_state,
                                                         *str,
                                                         ctx->next_state);
        }

        if (def->in_state_events[ctx->next_state])
            def->in_state_events[ctx->next_state](ctx,
                                                  ctx->current_state,
                                                  *str,
                                                  ctx->next_state);

        /* We need two bytes left so we can NULL terminate the string. */
        if (ctx->recording &&
            STATEMACHINE_RECORD_BUFFER_SIZE - 1 > ctx->record_pos) {
            ctx->record_buffer[ctx->record_pos++] = *str;
            ctx->record_buffer[ctx->record_pos] = '\0';
        }

/* TODO(falmeida): Should clarify the contract here, since an event can change
 * ctx->next_state and we need this functionality */

        ctx->current_state = ctx->next_state;
        ctx->column_number++;

        if (*str == '\n') {
          ctx->line_number++;
          ctx->column_number = 1;
        }
        str++;
    }

    return ctx->current_state;
}